

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeToFieldMask
          (FieldMaskTree *this,string *prefix,Node *node,FieldMask *out)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  _Rb_tree_node_base *p_Var1;
  undefined1 local_78 [8];
  string current_path;
  
  if (prefix[1]._M_string_length == 0) {
    if (*(long *)&(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header != 0) {
      FieldMask::add_paths((FieldMask *)node,(string *)this);
      return;
    }
  }
  else {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (current_path.field_2._M_local_buf + 8);
    for (p_Var1 = *(_Rb_tree_node_base **)((long)&prefix->field_2 + 8);
        p_Var1 != (_Rb_tree_node_base *)&prefix->_M_string_length;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      if (*(long *)&(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header == 0) {
        std::__cxx11::string::string((string *)local_78,(string *)(p_Var1 + 1));
      }
      else {
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,"."
                      );
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78
                       ,__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var1 + 1));
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
      }
      MergeToFieldMask((FieldMaskTree *)local_78,*(string **)(p_Var1 + 2),node,out);
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void FieldMaskTree::MergeToFieldMask(const std::string& prefix,
                                     const Node* node, FieldMask* out) {
  if (node->children.empty()) {
    if (prefix.empty()) {
      // This is the root node.
      return;
    }
    out->add_paths(prefix);
    return;
  }
  for (std::map<std::string, Node*>::const_iterator it = node->children.begin();
       it != node->children.end(); ++it) {
    std::string current_path =
        prefix.empty() ? it->first : prefix + "." + it->first;
    MergeToFieldMask(current_path, it->second, out);
  }
}